

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::StatRegisterer::StatRegisterer(StatRegisterer *this,AccumFunc func,PixelAccumFunc pfunc)

{
  iterator __position;
  iterator __position_00;
  int iVar1;
  vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>> *this_00
  ;
  vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
  *this_01;
  undefined8 uVar2;
  PixelAccumFunc local_20;
  AccumFunc local_18;
  
  local_20 = pfunc;
  local_18 = func;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&StatRegisterer::mutex);
  if (iVar1 == 0) {
    this_00 = statFuncs;
    if (statFuncs ==
        (vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>> *
        )0x0) {
      this_00 = (vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>>
                 *)operator_new(0x18);
      *(undefined8 *)(this_00 + 0x10) = 0;
      statFuncs = this_00;
      *(undefined8 *)this_00 = 0;
      *(undefined8 *)(this_00 + 8) = 0;
    }
    if (func != (AccumFunc)0x0) {
      __position._M_current = *(_func_void_StatsAccumulator_ptr ***)(this_00 + 8);
      if (__position._M_current == *(_func_void_StatsAccumulator_ptr ***)(this_00 + 0x10)) {
        std::
        vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>>::
        _M_realloc_insert<void(*const&)(pbrt::StatsAccumulator&)>(this_00,__position,&local_18);
      }
      else {
        *__position._M_current = func;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    this_01 = pixelStatFuncs;
    if (pixelStatFuncs ==
        (vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
         *)0x0) {
      this_01 = (vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
                 *)operator_new(0x18);
      *(undefined8 *)(this_01 + 0x10) = 0;
      pixelStatFuncs = this_01;
      *(undefined8 *)this_01 = 0;
      *(undefined8 *)(this_01 + 8) = 0;
    }
    if (pfunc != (PixelAccumFunc)0x0) {
      __position_00._M_current =
           *(_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr ***)(this_01 + 8);
      if (__position_00._M_current ==
          *(_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr ***)(this_01 + 0x10)) {
        std::
        vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
        ::_M_realloc_insert<void(*const&)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>
                  (this_01,__position_00,
                   (_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr **)&local_20);
      }
      else {
        *__position_00._M_current =
             (_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr *)pfunc;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StatRegisterer::mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&StatRegisterer::mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

StatRegisterer::StatRegisterer(AccumFunc func, PixelAccumFunc pfunc) {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    if (statFuncs == nullptr)
        statFuncs = new std::vector<AccumFunc>;
    if (func)
        statFuncs->push_back(func);

    if (pixelStatFuncs == nullptr)
        pixelStatFuncs = new std::vector<PixelAccumFunc>;
    if (pfunc)
        pixelStatFuncs->push_back(pfunc);
}